

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_183::InfoCollector::visitRefAs(InfoCollector *this,RefAs *curr)

{
  PossibleContents local_38;
  RefAs *local_18;
  RefAs *curr_local;
  InfoCollector *this_local;
  
  local_18 = curr;
  curr_local = (RefAs *)this;
  if ((curr->op == ExternConvertAny) || (curr->op == AnyConvertExtern)) {
    PossibleContents::many();
    addRoot(this,(Expression *)curr,&local_38);
    PossibleContents::~PossibleContents(&local_38);
  }
  else {
    receiveChildValue(this,curr->value,(Expression *)curr);
  }
  return;
}

Assistant:

void visitRefAs(RefAs* curr) {
    if (curr->op == ExternConvertAny || curr->op == AnyConvertExtern) {
      // The external conversion ops emit something of a completely different
      // type, which we must mark as a root.
      addRoot(curr);
      return;
    }

    // All other RefAs operations flow values through while refining them (the
    // filterExpressionContents method will handle the refinement
    // automatically).
    receiveChildValue(curr->value, curr);
  }